

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O3

void __thiscall
helics::ActionMessage::setStringData
          (ActionMessage *this,string_view string1,string_view string2,string_view string3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer pbVar1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->stringData,3);
  this_00 = (this->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (this_00,0,this_00->_M_string_length,string1._M_str,string1._M_len);
  pbVar1 = (this->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (pbVar1 + 1,0,pbVar1[1]._M_string_length,string2._M_str,string2._M_len);
  pbVar1 = (this->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (pbVar1 + 2,0,pbVar1[2]._M_string_length,string3._M_str,string3._M_len);
  return;
}

Assistant:

void setStringData(std::string_view string1, std::string_view string2, std::string_view string3)
    {
        stringData.resize(3);
        stringData[0] = string1;
        stringData[1] = string2;
        stringData[2] = string3;
    }